

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void NULLC::TraceLabel(char *begin,char *end)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  lVar2 = traceContext;
  iVar4 = (int)((long)end - (long)begin);
  if (iVar4 != 0) {
    uVar5 = iVar4 + 1;
    uVar3 = *(uint *)(traceContext + 0x264);
    if ((uVar3 <= *(int *)(traceContext + 0x260) + uVar5) ||
       (*(int *)(traceContext + 0x270) == *(int *)(traceContext + 0x274))) {
      TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 <= uVar5) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar3 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar3 + *(long *)(lVar2 + 0x268)),begin,
           (long)end - (long)begin & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar2 + 0x268) + (ulong)(uint)(*(int *)(lVar2 + 0x260) + iVar4)) = 0;
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar5;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar5 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar5 + 1;
    *(uint *)(lVar1 + (ulong)uVar5 * 8) = uVar3 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar5 * 8) = 0;
  }
  return;
}

Assistant:

inline void TraceLabel(const char *begin, const char *end)
	{
		TraceContext &context = *traceContext;

		unsigned count = unsigned(end - begin);

		if(!count)
			return;

		if(context.labels.count + count + 1 >= context.labels.max || context.events.count == context.events.max)
			TraceDump();

		assert(count + 1 < context.labels.max);

		unsigned token = context.labels.count;

		memcpy(&context.labels.data[context.labels.count], begin, count);
		context.labels.data[context.labels.count + count] = 0;
		context.labels.count += count + 1;

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = true;
		traceEvent.token = token;
		traceEvent.ts = 0;
	}